

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt_copy_propagation_elements.cpp
# Opt level: O0

bool do_copy_propagation_elements(exec_list *instructions)

{
  undefined1 local_78 [8];
  ir_copy_propagation_elements_visitor v;
  exec_list *instructions_local;
  
  v.shader_mem_ctx = instructions;
  anon_unknown.dwarf_7352a::ir_copy_propagation_elements_visitor::
  ir_copy_propagation_elements_visitor((ir_copy_propagation_elements_visitor *)local_78);
  visit_list_elements((ir_hierarchical_visitor *)local_78,(exec_list *)v.shader_mem_ctx,true);
  anon_unknown.dwarf_7352a::ir_copy_propagation_elements_visitor::
  ~ir_copy_propagation_elements_visitor((ir_copy_propagation_elements_visitor *)local_78);
  return (bool)((byte)v.kills & 1);
}

Assistant:

bool
do_copy_propagation_elements(exec_list *instructions)
{
   ir_copy_propagation_elements_visitor v;

   visit_list_elements(&v, instructions);

   return v.progress;
}